

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMModule.c
# Opt level: O3

int init(EVP_PKEY_CTX *ctx)

{
  MCRegisterInfo *MRI;
  
  if ((*(uint *)(ctx + 4) & 0x7fffffff) != 0) {
    return 5;
  }
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  AArch64_init(MRI);
  *(code **)(ctx + 8) = AArch64_printInst;
  *(MCRegisterInfo **)(ctx + 0x10) = MRI;
  *(MCRegisterInfo **)(ctx + 0x20) = MRI;
  *(code **)(ctx + 0x18) = AArch64_getInstruction;
  *(code **)(ctx + 0x30) = AArch64_reg_name;
  *(code **)(ctx + 0x48) = AArch64_get_insn_id;
  *(code **)(ctx + 0x38) = AArch64_insn_name;
  *(code **)(ctx + 0x40) = AArch64_group_name;
  *(code **)(ctx + 0x50) = AArch64_post_printer;
  return 0;
}

Assistant:

static cs_err init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	// verify if requested mode is valid
	if (ud->mode & ~(CS_MODE_LITTLE_ENDIAN | CS_MODE_ARM | CS_MODE_V8 |
				CS_MODE_MCLASS | CS_MODE_THUMB | CS_MODE_BIG_ENDIAN))
		return CS_ERR_MODE;

	mri = cs_mem_malloc(sizeof(*mri));

	ARM_init(mri);
	ARM_getRegName(ud, 0);	// use default get_regname

	ud->printer = ARM_printInst;
	ud->printer_info = mri;
	ud->reg_name = ARM_reg_name;
	ud->insn_id = ARM_get_insn_id;
	ud->insn_name = ARM_insn_name;
	ud->group_name = ARM_group_name;
	ud->post_printer = ARM_post_printer;

	if (ud->mode & CS_MODE_THUMB)
		ud->disasm = Thumb_getInstruction;
	else
		ud->disasm = ARM_getInstruction;

	return CS_ERR_OK;
}